

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric_input.cpp
# Opt level: O2

void Omega_h::add_implied_metric_based_on_target(Mesh *mesh)

{
  Int IVar1;
  TagBase *this;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"target_metric",&local_31);
  this = Mesh::get_tagbase(mesh,0,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  IVar1 = Mesh::dim(mesh);
  if ((1 < IVar1) && (IVar1 = TagBase::ncomps(this), IVar1 == 1)) {
    add_implied_isos_tag(mesh);
    return;
  }
  add_implied_metric_tag(mesh);
  return;
}

Assistant:

void add_implied_metric_based_on_target(Mesh* mesh) {
  auto target_tagbase = mesh->get_tagbase(VERT, "target_metric");
  if (mesh->dim() > 1 && target_tagbase->ncomps() == 1) {
    add_implied_isos_tag(mesh);
  } else {
    add_implied_metric_tag(mesh);
  }
}